

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O3

void __thiscall
Assimp::PLYImporter::LoadVertex
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  uint uVar1;
  pointer pPVar2;
  pointer pPVar3;
  double dVar4;
  PLYImporter *pPVar5;
  aiMesh *paVar6;
  aiVector3D *paVar7;
  aiColor4D *paVar8;
  runtime_error *prVar9;
  EDataType EVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  EDataType EVar14;
  pointer pPVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float local_b0;
  EDataType local_ac;
  EDataType local_a8;
  float local_a4;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  int local_64;
  int local_60;
  float local_5c;
  PLYImporter *local_58;
  EDataType local_4c;
  EDataType local_48;
  EDataType local_44;
  EDataType local_40;
  EDataType local_3c;
  int local_38;
  uint local_34;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x116,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  local_58 = this;
  local_34 = pos;
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x117,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  pPVar15 = (pcElement->alProperties).
            super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (pcElement->alProperties).
           super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar15 == pPVar2) {
    return;
  }
  EVar10 = EDT_Char;
  iVar13 = -1;
  iVar22 = -1;
  iVar20 = -1;
  EVar14 = EDT_Char;
  local_a8 = EDT_Char;
  local_60 = -1;
  iVar19 = -1;
  iVar12 = -1;
  local_b0 = 0.0;
  local_70 = 0.0;
  local_74 = 0.0;
  iVar17 = 0;
  iVar21 = 0;
  local_4c = EDT_Char;
  local_ac = EDT_Char;
  local_5c = -NAN;
  local_38 = -1;
  local_48 = EDT_Char;
  local_44 = EDT_Char;
  local_40 = EDT_Char;
  local_3c = EDT_Char;
  local_64 = -1;
  local_a4 = -NAN;
  local_68 = -NAN;
  local_6c = -NAN;
  do {
    if (pPVar15->bIsList == false) {
      switch(pPVar15->Semantic) {
      case EST_XCoord:
        iVar17 = iVar17 + 1;
        EVar10 = pPVar15->eType;
        iVar20 = iVar21;
        break;
      case EST_YCoord:
        iVar17 = iVar17 + 1;
        EVar14 = pPVar15->eType;
        iVar22 = iVar21;
        break;
      case EST_ZCoord:
        iVar17 = iVar17 + 1;
        local_a8 = pPVar15->eType;
        iVar13 = iVar21;
        break;
      case EST_XNormal:
        iVar17 = iVar17 + 1;
        local_b0 = (float)pPVar15->eType;
        iVar12 = iVar21;
        break;
      case EST_YNormal:
        iVar17 = iVar17 + 1;
        local_70 = (float)pPVar15->eType;
        iVar19 = iVar21;
        break;
      case EST_ZNormal:
        iVar17 = iVar17 + 1;
        local_74 = (float)pPVar15->eType;
        local_60 = iVar21;
        break;
      case EST_UTextureCoord:
        iVar17 = iVar17 + 1;
        local_ac = pPVar15->eType;
        local_5c = (float)iVar21;
        break;
      case EST_VTextureCoord:
        iVar17 = iVar17 + 1;
        local_4c = pPVar15->eType;
        local_38 = iVar21;
        break;
      case EST_Red:
        iVar17 = iVar17 + 1;
        local_3c = pPVar15->eType;
        local_64 = iVar21;
        break;
      case EST_Green:
        iVar17 = iVar17 + 1;
        local_40 = pPVar15->eType;
        local_a4 = (float)iVar21;
        break;
      case EST_Blue:
        iVar17 = iVar17 + 1;
        local_44 = pPVar15->eType;
        local_68 = (float)iVar21;
        break;
      case EST_Alpha:
        iVar17 = iVar17 + 1;
        local_48 = pPVar15->eType;
        local_6c = (float)iVar21;
      }
    }
    pPVar15 = pPVar15 + 1;
    iVar21 = iVar21 + 1;
  } while (pPVar15 != pPVar2);
  if (iVar17 == 0) {
    return;
  }
  local_78 = 0.0;
  fVar27 = 0.0;
  if (iVar20 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)iVar20;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (EVar10 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar27 = SUB84(dVar4,0);
      switch(EVar10) {
      default:
        fVar27 = (float)(int)fVar27;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar27 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar27 = (float)dVar4;
      }
    }
  }
  if (iVar22 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)iVar22;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (EVar14 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_78 = SUB84(dVar4,0);
      switch(EVar14) {
      default:
        local_78 = (float)(int)local_78;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_78 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        local_78 = (float)dVar4;
      }
    }
  }
  local_7c = 0.0;
  fVar28 = 0.0;
  if (iVar13 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)iVar13;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_a8 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar28 = SUB84(dVar4,0);
      switch(local_a8) {
      default:
        fVar28 = (float)(int)fVar28;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar28 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar28 = (float)dVar4;
      }
    }
  }
  bVar24 = iVar12 != -1;
  if (bVar24) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)iVar12;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((uint)local_b0 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_7c = SUB84(dVar4,0);
      switch(local_b0) {
      default:
        local_7c = (float)(int)local_7c;
        break;
      case 1.4013e-45:
      case 4.2039e-45:
      case 7.00649e-45:
        local_7c = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case 8.40779e-45:
        break;
      case 9.80909e-45:
        local_7c = (float)dVar4;
      }
    }
  }
  local_80 = 0.0;
  local_b0 = 0.0;
  if (iVar19 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)iVar19;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar24 = true;
    local_b0 = 0.0;
    if ((uint)local_70 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      switch(local_70) {
      default:
        local_b0 = (float)(int)SUB84(dVar4,0);
        break;
      case 1.4013e-45:
      case 4.2039e-45:
      case 7.00649e-45:
        local_b0 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case 8.40779e-45:
        local_b0 = SUB84(dVar4,0);
        break;
      case 9.80909e-45:
        local_b0 = (float)dVar4;
      }
    }
  }
  if (local_60 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)local_60;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar24 = true;
    if ((uint)local_74 < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_80 = SUB84(dVar4,0);
      switch(local_74) {
      default:
        local_80 = (float)(int)local_80;
        break;
      case 1.4013e-45:
      case 4.2039e-45:
      case 7.00649e-45:
        local_80 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case 8.40779e-45:
        break;
      case 9.80909e-45:
        local_80 = (float)dVar4;
      }
    }
  }
  local_74 = 0.0;
  local_70 = 0.0;
  bVar25 = local_64 != -1;
  if (bVar25) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)local_64;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_70 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar16].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_3c);
  }
  if (local_a4 != -NAN) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)(int)local_a4;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_74 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar16].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_40);
    bVar25 = true;
  }
  if (local_68 == -NAN) {
    local_68 = 0.0;
  }
  else {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)(int)local_68;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_68 = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar16].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_44);
    bVar25 = true;
  }
  if (local_6c == -NAN) {
    local_6c = 1.0;
  }
  else {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)(int)local_6c;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_6c = NormalizeColorValue(**(ValueUnion **)
                                     &pPVar3[uVar16].avList.
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ,local_48);
    bVar25 = true;
  }
  fVar26 = 0.0;
  local_a4 = 0.0;
  local_60 = CONCAT31(local_60._1_3_,local_5c != -NAN);
  if (local_5c != -NAN) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)(int)local_5c;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_ac < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      fVar26 = SUB84(dVar4,0);
      switch(local_ac) {
      default:
        fVar26 = (float)(int)fVar26;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        fVar26 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        fVar26 = (float)dVar4;
      }
    }
  }
  local_64 = CONCAT31(local_64._1_3_,bVar25);
  local_5c = fVar26;
  if (local_38 != -1) {
    pPVar3 = (instElement->alProperties).
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)local_38;
    uVar18 = ((long)(instElement->alProperties).
                    super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
             -0x5555555555555555;
    if (uVar18 < uVar16 || uVar18 - uVar16 == 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar9,(string *)local_a0);
      *(undefined ***)prVar9 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_60 = CONCAT31(local_60._1_3_,1);
    if (local_4c < EDT_INVALID) {
      dVar4 = **(double **)
                &pPVar3[uVar16].avList.
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
      ;
      local_a4 = SUB84(dVar4,0);
      switch(local_4c) {
      default:
        local_a4 = (float)(int)local_a4;
        break;
      case EDT_UChar:
      case EDT_UShort:
      case EDT_UInt:
        local_a4 = (float)((ulong)dVar4 & 0xffffffff);
        break;
      case EDT_Float:
        break;
      case EDT_Double:
        local_a4 = (float)dVar4;
      }
    }
  }
  paVar6 = local_58->mGeneratedMesh;
  if (paVar6 == (aiMesh *)0x0) {
    paVar6 = (aiMesh *)operator_new(0x520);
    paVar6->mPrimitiveTypes = 0;
    paVar6->mNumVertices = 0;
    paVar6->mNumFaces = 0;
    memset(&paVar6->mVertices,0,0xcc);
    paVar6->mBones = (aiBone **)0x0;
    paVar6->mMaterialIndex = 0;
    (paVar6->mName).length = 0;
    (paVar6->mName).data[0] = '\0';
    memset((paVar6->mName).data + 1,0x1b,0x3ff);
    paVar6->mNumAnimMeshes = 0;
    paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar6->mMethod = 0;
    (paVar6->mAABB).mMin.x = 0.0;
    (paVar6->mAABB).mMin.y = 0.0;
    (paVar6->mAABB).mMin.z = 0.0;
    (paVar6->mAABB).mMax.x = 0.0;
    (paVar6->mAABB).mMax.y = 0.0;
    (paVar6->mAABB).mMax.z = 0.0;
    memset(paVar6->mColors,0,0xa0);
    local_58->mGeneratedMesh = paVar6;
  }
  else {
    paVar7 = paVar6->mVertices;
    if (paVar7 != (aiVector3D *)0x0) goto LAB_00480b24;
  }
  paVar6->mNumVertices = pcElement->NumOccur;
  paVar6 = local_58->mGeneratedMesh;
  uVar18 = (ulong)paVar6->mNumVertices;
  uVar16 = uVar18 * 0xc;
  paVar7 = (aiVector3D *)operator_new__(uVar16);
  if (uVar18 != 0) {
    memset(paVar7,0,((uVar16 - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar6->mVertices = paVar7;
  paVar7 = local_58->mGeneratedMesh->mVertices;
LAB_00480b24:
  uVar16 = (ulong)local_34;
  paVar7[uVar16].x = fVar27;
  paVar7[uVar16].y = local_78;
  paVar7[uVar16].z = fVar28;
  cVar11 = (char)local_64;
  if (bVar24) {
    paVar6 = local_58->mGeneratedMesh;
    paVar7 = paVar6->mNormals;
    if (paVar7 == (aiVector3D *)0x0) {
      uVar1 = paVar6->mNumVertices;
      uVar18 = (ulong)uVar1 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar18);
      if ((ulong)uVar1 != 0) {
        memset(paVar7,0,((uVar18 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar6->mNormals = paVar7;
      paVar7 = local_58->mGeneratedMesh->mNormals;
      cVar11 = (char)local_64;
    }
    paVar7[uVar16].x = local_7c;
    paVar7[uVar16].y = local_b0;
    paVar7[uVar16].z = local_80;
  }
  if (cVar11 != '\0') {
    paVar6 = local_58->mGeneratedMesh;
    paVar8 = paVar6->mColors[0];
    if (paVar8 == (aiColor4D *)0x0) {
      uVar1 = paVar6->mNumVertices;
      uVar18 = (ulong)uVar1 << 4;
      paVar8 = (aiColor4D *)operator_new__(uVar18);
      if ((ulong)uVar1 != 0) {
        memset(paVar8,0,uVar18);
      }
      paVar6->mColors[0] = paVar8;
      paVar8 = local_58->mGeneratedMesh->mColors[0];
    }
    paVar8[uVar16].r = local_70;
    paVar8[uVar16].g = local_74;
    paVar8[uVar16].b = local_68;
    paVar8[uVar16].a = local_6c;
  }
  pPVar5 = local_58;
  if ((char)local_60 != '\0') {
    paVar7 = local_58->mGeneratedMesh->mTextureCoords[0];
    if (paVar7 == (aiVector3D *)0x0) {
      local_58->mGeneratedMesh->mNumUVComponents[0] = 2;
      paVar6 = local_58->mGeneratedMesh;
      uVar23 = (ulong)paVar6->mNumVertices;
      uVar18 = uVar23 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar18);
      if (uVar23 != 0) {
        memset(paVar7,0,((uVar18 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar6->mTextureCoords[0] = paVar7;
      paVar7 = pPVar5->mGeneratedMesh->mTextureCoords[0];
    }
    paVar7[uVar16].x = local_5c;
    paVar7[uVar16].y = local_a4;
    paVar7[uVar16].z = 0.0;
  }
  return;
}

Assistant:

void PLYImporter::LoadVertex(const PLY::Element* pcElement, const PLY::ElementInstance* instElement, unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    ai_uint aiPositions[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    ai_uint aiNormal[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiNormalTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiColors[4] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiColorsTypes[4] = { EDT_Char, EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiTexcoord[2] = { 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTexcoordTypes[2] = { EDT_Char, EDT_Char };

    // now check whether which normal components are available
    unsigned int _a( 0 ), cnt( 0 );
    for ( std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
            a != pcElement->alProperties.end(); ++a, ++_a) {
        if ((*a).bIsList) {
            continue;
        }

        // Positions
        if (PLY::EST_XCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[0] = _a;
            aiTypes[0] = (*a).eType;
        } else if (PLY::EST_YCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[1] = _a;
            aiTypes[1] = (*a).eType;
        } else if (PLY::EST_ZCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[2] = _a;
            aiTypes[2] = (*a).eType;
        } else if (PLY::EST_XNormal == (*a).Semantic) {
            // Normals
            ++cnt;
            aiNormal[0] = _a;
            aiNormalTypes[0] = (*a).eType;
        } else if (PLY::EST_YNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[1] = _a;
            aiNormalTypes[1] = (*a).eType;
        } else if (PLY::EST_ZNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[2] = _a;
            aiNormalTypes[2] = (*a).eType;
        } else if (PLY::EST_Red == (*a).Semantic) {
            // Colors
            ++cnt;
            aiColors[0] = _a;
            aiColorsTypes[0] = (*a).eType;
        } else if (PLY::EST_Green == (*a).Semantic) {
            ++cnt;
            aiColors[1] = _a;
            aiColorsTypes[1] = (*a).eType;
        } else if (PLY::EST_Blue == (*a).Semantic) {
            ++cnt;
            aiColors[2] = _a;
            aiColorsTypes[2] = (*a).eType;
        } else if (PLY::EST_Alpha == (*a).Semantic) {
            ++cnt;
            aiColors[3] = _a;
            aiColorsTypes[3] = (*a).eType;
        } else if (PLY::EST_UTextureCoord == (*a).Semantic) {
            // Texture coordinates
            ++cnt;
            aiTexcoord[0] = _a;
            aiTexcoordTypes[0] = (*a).eType;
        } else if (PLY::EST_VTextureCoord == (*a).Semantic) {
            ++cnt;
            aiTexcoord[1] = _a;
            aiTexcoordTypes[1] = (*a).eType;
        }
    }

    // check whether we have a valid source for the vertex data
    if (0 != cnt) {
        // Position
        aiVector3D vOut;
        if (0xFFFFFFFF != aiPositions[0]) {
            vOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[0]).avList.front(), aiTypes[0]);
        }

        if (0xFFFFFFFF != aiPositions[1]) {
            vOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[1]).avList.front(), aiTypes[1]);
        }

        if (0xFFFFFFFF != aiPositions[2]) {
            vOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[2]).avList.front(), aiTypes[2]);
        }

        // Normals
        aiVector3D nOut;
        bool haveNormal = false;
        if (0xFFFFFFFF != aiNormal[0]) {
            nOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[0]).avList.front(), aiNormalTypes[0]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[1]) {
            nOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[1]).avList.front(), aiNormalTypes[1]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[2]) {
            nOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[2]).avList.front(), aiNormalTypes[2]);
            haveNormal = true;
        }

        //Colors
        aiColor4D cOut;
        bool haveColor = false;
        if (0xFFFFFFFF != aiColors[0]) {
            cOut.r = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[0]).avList.front(), aiColorsTypes[0]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[1]) {
            cOut.g = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[1]).avList.front(), aiColorsTypes[1]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[2]) {
            cOut.b = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[2]).avList.front(), aiColorsTypes[2]);
            haveColor = true;
        }

        // assume 1.0 for the alpha channel if it is not set
        if (0xFFFFFFFF == aiColors[3]) {
            cOut.a = 1.0;
        } else {
            cOut.a = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[3]).avList.front(), aiColorsTypes[3]);

            haveColor = true;
        }

        //Texture coordinates
        aiVector3D tOut;
        tOut.z = 0;
        bool haveTextureCoords = false;
        if (0xFFFFFFFF != aiTexcoord[0]) {
            tOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[0]).avList.front(), aiTexcoordTypes[0]);
            haveTextureCoords = true;
        }

        if (0xFFFFFFFF != aiTexcoord[1]) {
            tOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[1]).avList.front(), aiTexcoordTypes[1]);
            haveTextureCoords = true;
        }

        //create aiMesh if needed
        if ( nullptr == mGeneratedMesh ) {
            mGeneratedMesh = new aiMesh();
            mGeneratedMesh->mMaterialIndex = 0;
        }

        if (nullptr == mGeneratedMesh->mVertices) {
            mGeneratedMesh->mNumVertices = pcElement->NumOccur;
            mGeneratedMesh->mVertices = new aiVector3D[mGeneratedMesh->mNumVertices];
        }

        mGeneratedMesh->mVertices[pos] = vOut;

        if (haveNormal) {
            if (nullptr == mGeneratedMesh->mNormals)
                mGeneratedMesh->mNormals = new aiVector3D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mNormals[pos] = nOut;
        }

        if (haveColor) {
            if (nullptr == mGeneratedMesh->mColors[0])
                mGeneratedMesh->mColors[0] = new aiColor4D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mColors[0][pos] = cOut;
        }

        if (haveTextureCoords) {
            if (nullptr == mGeneratedMesh->mTextureCoords[0]) {
                mGeneratedMesh->mNumUVComponents[0] = 2;
                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
            }
            mGeneratedMesh->mTextureCoords[0][pos] = tOut;
        }
    }
}